

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O0

int __thiscall Cleaner::CleanRule(Cleaner *this,Rule *rule)

{
  Rule *rule_local;
  Cleaner *this_local;
  
  if (rule != (Rule *)0x0) {
    Reset(this);
    PrintHeader(this);
    LoadDyndeps(this);
    DoCleanRule(this,rule);
    PrintFooter(this);
    return this->status_;
  }
  __assert_fail("rule",
                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean.cc"
                ,0xe5,"int Cleaner::CleanRule(const Rule *)");
}

Assistant:

int Cleaner::CleanRule(const Rule* rule) {
  assert(rule);

  Reset();
  PrintHeader();
  LoadDyndeps();
  DoCleanRule(rule);
  PrintFooter();
  return status_;
}